

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>::parse
          (parser_conffile_impl_t<cfgfile::string_trait_t> *this,string_t *file_name)

{
  tag_t<cfgfile::string_trait_t> *ptVar1;
  tag_t<cfgfile::string_trait_t> **pptVar2;
  bool bVar3;
  int iVar4;
  _Elt_pointer pptVar5;
  undefined4 extraout_var;
  exception_t<cfgfile::string_trait_t> *this_00;
  _Elt_pointer pptVar6;
  allocator local_2d5;
  allocator local_2d4;
  allocator local_2d3;
  allocator local_2d2;
  allocator local_2d1;
  string_t *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  *local_2b0;
  undefined1 local_2a8 [40];
  undefined4 uStack_280;
  undefined4 uStack_27c;
  lexeme_t<cfgfile::string_trait_t> lexeme;
  string local_250 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_2d0 = file_name;
  bVar3 = start_first_tag_parsing(this);
  if (bVar3) {
    lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme(&lexeme,&this->m_lex);
    local_2b0 = &(this->super_parser_base_t<cfgfile::string_trait_t>).m_stack;
    while( true ) {
      if (lexeme.m_type == null) break;
      pptVar5 = (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
                super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar5 ==
          (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
          super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  (local_130,"Unexpected content. We\'ve finished parsing, but we\'ve got this: \"",
                   &local_2d1);
        std::__cxx11::string::string((string *)&local_110,local_130);
        std::operator+(&local_f0,&local_110,&lexeme.m_value);
        std::__cxx11::string::string(local_170,"\". ",&local_2d2);
        std::__cxx11::string::string((string *)&local_150,local_170);
        std::operator+(&local_d0,&local_f0,&local_150);
        std::__cxx11::string::string(local_1b0,"In file \"",&local_2d3);
        std::__cxx11::string::string((string *)&local_190,local_1b0);
        std::operator+(&local_b0,&local_d0,&local_190);
        std::operator+(&local_90,&local_b0,local_2d0);
        std::__cxx11::string::string(local_1f0,"\" on line ",&local_2d4);
        std::__cxx11::string::string((string *)&local_1d0,local_1f0);
        std::operator+(&local_70,&local_90,&local_1d0);
        std::__cxx11::to_string(&local_210,(this->m_lex).m_line_number);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2a8,&local_70,&local_210);
        std::__cxx11::string::string(local_250,".",&local_2d5);
        std::__cxx11::string::string((string *)&local_230,local_250);
        std::operator+(&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2a8,&local_230);
        exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_50);
        __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
                    exception_t<cfgfile::string_trait_t>::~exception_t);
      }
      if (lexeme.m_type == start) {
        if (pptVar5 ==
            (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
            super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pptVar2 = (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
                    super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          pptVar6 = pptVar2 + 0x3f;
          pptVar5 = pptVar2 + 0x40;
        }
        else {
          pptVar6 = pptVar5 + -1;
        }
        ptVar1 = *pptVar6;
        iVar4 = (*pptVar5[-1]->_vptr_tag_t[2])();
        start_tag_parsing(this,ptVar1,(child_tags_list_t *)CONCAT44(extraout_var,iVar4));
      }
      else if (lexeme.m_type == finish) {
        if (pptVar5 ==
            (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
            super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pptVar5 = (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
                    super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        ptVar1 = pptVar5[-1];
        local_2c8 = (this->m_lex).m_line_number;
        uStack_2c0 = (this->m_lex).m_column_number;
        std::__cxx11::string::string((string *)local_2a8,(string *)local_2d0);
        local_2a8._32_4_ = (undefined4)local_2c8;
        local_2a8._36_4_ = local_2c8._4_4_;
        uStack_280 = (undefined4)uStack_2c0;
        uStack_27c = uStack_2c0._4_4_;
        (*ptVar1->_vptr_tag_t[5])(ptVar1,(lexeme_t<cfgfile::string_trait_t> *)local_2a8);
        std::__cxx11::string::~string((string *)local_2a8);
        std::
        deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
        ::pop_back(&local_2b0->c);
      }
      else if (lexeme.m_type == string) {
        if (pptVar5 ==
            (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
            super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pptVar5 = (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
                    super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        ptVar1 = pptVar5[-1];
        local_2c8 = (this->m_lex).m_line_number;
        uStack_2c0 = (this->m_lex).m_column_number;
        std::__cxx11::string::string((string *)local_2a8,(string *)local_2d0);
        local_2a8._32_4_ = (undefined4)local_2c8;
        local_2a8._36_4_ = local_2c8._4_4_;
        uStack_280 = (undefined4)uStack_2c0;
        uStack_27c = uStack_2c0._4_4_;
        (*ptVar1->_vptr_tag_t[6])
                  (ptVar1,(lexeme_t<cfgfile::string_trait_t> *)local_2a8,&lexeme.m_value);
        std::__cxx11::string::~string((string *)local_2a8);
      }
      lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme
                ((lexeme_t<cfgfile::string_trait_t> *)local_2a8,&this->m_lex);
      lexeme_t<cfgfile::string_trait_t>::operator=
                (&lexeme,(lexeme_t<cfgfile::string_trait_t> *)local_2a8);
      std::__cxx11::string::~string((string *)(local_2a8 + 8));
    }
    parser_base_t<cfgfile::string_trait_t>::check_parser_state_after_parsing
              (&this->super_parser_base_t<cfgfile::string_trait_t>);
    std::__cxx11::string::~string((string *)&lexeme.m_value);
  }
  return;
}

Assistant:

void parse( const typename Trait::string_t & file_name ) override
	{
		if( !start_first_tag_parsing() )
			return;

		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		while( !lexeme.is_null() )
		{
			if( !this->m_stack.empty() )
			{
				switch( lexeme.type() )
				{
					case lexeme_type_t::start :
						start_tag_parsing( *this->m_stack.top(),
							this->m_stack.top()->children() );
						break;

					case lexeme_type_t::string :
						this->m_stack.top()->on_string( parser_info_t< Trait >(
								file_name,
								m_lex.line_number(),
								m_lex.column_number() ),
							lexeme.value() );
						break;

					case lexeme_type_t::finish :
					{
						this->m_stack.top()->on_finish( parser_info_t< Trait >(
							file_name,
							m_lex.line_number(),
							m_lex.column_number() ) );
						this->m_stack.pop();
					}
						break;

					default:
						break;
				}
			}
			else
				throw exception_t< Trait >(
					Trait::from_ascii( "Unexpected content. "
						"We've finished parsing, but we've got this: \"" ) +
					lexeme.value() + Trait::from_ascii( "\". " ) +
					Trait::from_ascii( "In file \"" ) + file_name +
					Trait::from_ascii( "\" on line " ) +
					Trait::to_string( m_lex.line_number() ) +
					Trait::from_ascii( "." ) );


			lexeme = m_lex.next_lexeme();
		}

		this->check_parser_state_after_parsing();
	}